

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int StringReplaceWalker(jx9_value *pKey,jx9_value *pData,void *pUserData)

{
  SyBlob *pWorker;
  int iVar1;
  char *pcVar2;
  str_replace_data *pRepData;
  sxu32 nOfft;
  int tLen;
  int nLen;
  sxu32 local_2c;
  int local_28;
  int local_24;
  
  if ((pKey->iFlags & 1) != 0) {
    pWorker = *pUserData;
    pcVar2 = jx9_value_to_string(pKey,&local_28);
    if ((0 < local_28) &&
       (iVar1 = (**(code **)((long)pUserData + 8))
                          (pWorker->pBlob,pWorker->nByte,pcVar2,local_28,&local_2c), iVar1 == 0)) {
      pcVar2 = jx9_value_to_string(pData,&local_24);
      StringReplace(pWorker,local_2c,local_28,pcVar2,local_24);
    }
  }
  return 0;
}

Assistant:

static int StringReplaceWalker(jx9_value *pKey, jx9_value *pData, void *pUserData)
{
	str_replace_data *pRepData = (str_replace_data *)pUserData;
	const char *zTarget, *zReplace;
	SyBlob *pWorker;
	int tLen, nLen;
	sxu32 nOfft;
	sxi32 rc;
	/* Point to the working buffer */
	pWorker = pRepData->pWorker;
	if( !jx9_value_is_string(pKey) ){
		/* Target and replace must be a string */
		return JX9_OK;
	}
	/* Extract the target and the replace */
	zTarget = jx9_value_to_string(pKey, &tLen);
	if( tLen < 1 ){
		/* Empty target, return immediately */
		return JX9_OK;
	}
	/* Perform a pattern search */
	rc = pRepData->xMatch(SyBlobData(pWorker), SyBlobLength(pWorker), (const void *)zTarget, (sxu32)tLen, &nOfft);
	if( rc != SXRET_OK ){
		/* Pattern not found */
		return JX9_OK;
	}
	/* Extract the replace string */
	zReplace = jx9_value_to_string(pData, &nLen);
	/* Perform the replace process */
	StringReplace(pWorker, nOfft, tLen, zReplace, nLen);
	/* All done */
	return JX9_OK;
}